

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O2

Point2f pbrt::InvertSphericalRectangleSample
                  (Point3f *pRef,Point3f *s,Vector3f *ex,Vector3f *ey,Point3f *pRect)

{
  float fVar1;
  float fVar2;
  double dVar3;
  float fVar4;
  float fVar5;
  undefined8 uVar6;
  bool bVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int iVar12;
  long in_FS_OFFSET;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  Float FVar17;
  Float FVar18;
  Float FVar19;
  Float FVar20;
  float fVar21;
  float fVar22;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  Tuple2<pbrt::Point2,_float> TVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar51 [56];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 extraout_var_03 [56];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar53 [16];
  undefined1 auVar56 [60];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  float fVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  float fVar61;
  float fVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar65;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar68;
  float fVar69;
  undefined1 in_XMM10 [16];
  Vector3<float> VVar70;
  Vector3f VVar71;
  Vector3<float> VVar72;
  Vector3f v11;
  Vector3f v10;
  Vector3f v01;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  Tuple3<pbrt::Vector3,_float> local_128;
  float local_11c;
  undefined1 local_118 [8];
  float fStack_110;
  float fStack_10c;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  Tuple3<pbrt::Vector3,_float> local_d8;
  Tuple3<pbrt::Vector3,_float> local_c8;
  Tuple3<pbrt::Vector3,_float> local_b8;
  Tuple3<pbrt::Vector3,_float> local_a8;
  Tuple3<pbrt::Vector3,_float> local_98;
  Tuple3<pbrt::Vector3,_float> local_88;
  Frame local_78;
  Vector3<float> local_54;
  Vector3<float> local_48;
  Vector3<float> local_3c;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 auVar52 [56];
  
  fVar1 = (ex->super_Tuple3<pbrt::Vector3,_float>).y;
  auVar24 = ZEXT416((uint)(ex->super_Tuple3<pbrt::Vector3,_float>).x);
  auVar24 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * fVar1)),auVar24,auVar24);
  auVar25 = ZEXT416((uint)(ex->super_Tuple3<pbrt::Vector3,_float>).z);
  auVar24 = vfmadd213ss_fma(auVar25,auVar25,auVar24);
  fVar1 = (ey->super_Tuple3<pbrt::Vector3,_float>).y;
  auVar24 = vsqrtss_avx(auVar24,auVar24);
  auVar51 = ZEXT856(auVar24._8_8_);
  auVar25 = ZEXT416((uint)(ey->super_Tuple3<pbrt::Vector3,_float>).x);
  auVar25 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * fVar1)),auVar25,auVar25);
  auVar13 = ZEXT416((uint)(ey->super_Tuple3<pbrt::Vector3,_float>).z);
  auVar25 = vfmadd213ss_fma(auVar13,auVar13,auVar25);
  auVar25 = vsqrtss_avx(auVar25,auVar25);
  auVar56 = ZEXT1260(auVar25._4_12_);
  VVar70 = Tuple3<pbrt::Vector3,float>::operator/((Tuple3<pbrt::Vector3,float> *)ex,auVar24._0_4_);
  local_88.z = VVar70.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar32._0_8_ = VVar70.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar32._8_56_ = auVar51;
  local_88._0_8_ = vmovlps_avx(auVar32._0_16_);
  auVar51 = (undefined1  [56])0x0;
  VVar70 = Tuple3<pbrt::Vector3,float>::operator/((Tuple3<pbrt::Vector3,float> *)ey,auVar25._0_4_);
  local_98.z = VVar70.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar33._0_8_ = VVar70.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar33._8_56_ = auVar51;
  local_98._0_8_ = vmovlps_avx(auVar33._0_16_);
  Frame::FromXY(&local_78,(Vector3f *)&local_88,(Vector3f *)&local_98);
  VVar70 = Point3<float>::operator-(s,pRef);
  local_88.z = VVar70.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar34._0_8_ = VVar70.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar34._8_56_ = auVar51;
  local_88._0_8_ = vmovlps_avx(auVar34._0_16_);
  VVar71 = Frame::ToLocal(&local_78,(Vector3f *)&local_88);
  auVar54._0_4_ = VVar71.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar54._4_60_ = auVar56;
  local_f8 = auVar54._0_16_;
  auVar35._0_8_ = VVar71.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar35._8_56_ = auVar51;
  if (0.0 < auVar54._0_4_) {
    auVar13._0_8_ = local_78.z.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
    auVar13._8_4_ = 0x80000000;
    auVar13._12_4_ = 0x80000000;
    local_f8._0_8_ = CONCAT44(auVar56._0_4_,auVar54._0_4_) ^ 0x8000000080000000;
    local_f8._8_4_ = auVar56._4_4_ ^ 0x80000000;
    local_f8._12_4_ = auVar56._8_4_ ^ 0x80000000;
    local_78.z.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar13);
    local_78.z.super_Tuple3<pbrt::Vector3,_float>.z =
         -local_78.z.super_Tuple3<pbrt::Vector3,_float>.z;
  }
  local_e8 = auVar35._0_16_;
  local_108 = vmovshdup_avx(local_e8);
  local_3c.super_Tuple3<pbrt::Vector3,_float>.x = VVar71.super_Tuple3<pbrt::Vector3,_float>.x;
  fVar1 = local_3c.super_Tuple3<pbrt::Vector3,_float>.x + auVar24._0_4_;
  local_48.super_Tuple3<pbrt::Vector3,_float>.y = local_108._0_4_;
  local_54.super_Tuple3<pbrt::Vector3,_float>.y =
       local_48.super_Tuple3<pbrt::Vector3,_float>.y + auVar25._0_4_;
  local_98._0_8_ = vmovlps_avx(local_e8);
  local_98.z = local_f8._0_4_;
  _local_118 = ZEXT416((uint)local_54.super_Tuple3<pbrt::Vector3,_float>.y);
  local_54.super_Tuple3<pbrt::Vector3,_float>.x = fVar1;
  local_54.super_Tuple3<pbrt::Vector3,_float>.z = local_98.z;
  local_48.super_Tuple3<pbrt::Vector3,_float>.x = fVar1;
  local_48.super_Tuple3<pbrt::Vector3,_float>.z = local_98.z;
  local_3c.super_Tuple3<pbrt::Vector3,_float>.y = local_54.super_Tuple3<pbrt::Vector3,_float>.y;
  local_3c.super_Tuple3<pbrt::Vector3,_float>.z = local_98.z;
  VVar70 = Cross<float>((Vector3<float> *)&local_98,&local_48);
  local_a8.z = VVar70.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar36._0_8_ = VVar70.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar36._8_56_ = auVar51;
  local_a8._0_8_ = vmovlps_avx(auVar36._0_16_);
  VVar70 = Normalize<float>((Vector3<float> *)&local_a8);
  auVar37._0_8_ = VVar70.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar37._8_56_ = auVar51;
  local_c8._0_8_ = vmovlps_avx(auVar37._0_16_);
  auVar52 = auVar51;
  local_c8.z = VVar70.super_Tuple3<pbrt::Vector3,_float>.z;
  VVar72 = Cross<float>(&local_48,&local_54);
  local_d8.z = VVar72.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar38._0_8_ = VVar72.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar38._8_56_ = auVar52;
  local_d8._0_8_ = vmovlps_avx(auVar38._0_16_);
  VVar72 = Normalize<float>((Vector3<float> *)&local_d8);
  local_a8.z = VVar72.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar39._0_8_ = VVar72.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar39._8_56_ = auVar52;
  local_a8._0_8_ = vmovlps_avx(auVar39._0_16_);
  VVar72 = Cross<float>(&local_54,&local_3c);
  local_b8.z = VVar72.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar40._0_8_ = VVar72.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar40._8_56_ = auVar52;
  local_b8._0_8_ = vmovlps_avx(auVar40._0_16_);
  VVar72 = Normalize<float>((Vector3<float> *)&local_b8);
  local_d8.z = VVar72.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar41._0_8_ = VVar72.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar41._8_56_ = auVar52;
  local_d8._0_8_ = vmovlps_avx(auVar41._0_16_);
  VVar72 = Cross<float>(&local_3c,(Vector3<float> *)&local_98);
  local_128.z = VVar72.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar42._0_8_ = VVar72.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar42._8_56_ = auVar52;
  local_128._0_8_ = vmovlps_avx(auVar42._0_16_);
  VVar72 = Normalize<float>((Vector3<float> *)&local_128);
  local_b8.z = VVar72.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar43._0_8_ = VVar72.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar43._8_56_ = auVar52;
  local_b8._0_8_ = vmovlps_avx(auVar43._0_16_);
  auVar24._0_8_ = auVar37._0_8_ ^ 0x8000000080000000;
  auVar24._8_4_ = auVar51._0_4_ ^ 0x80000000;
  auVar24._12_4_ = auVar51._4_4_ ^ 0x80000000;
  local_128.z = -VVar70.super_Tuple3<pbrt::Vector3,_float>.z;
  local_128._0_8_ = vmovlps_avx(auVar24);
  FVar17 = AngleBetween<float>((Vector3<float> *)&local_128,(Vector3<float> *)&local_a8);
  auVar25._0_8_ = local_a8._0_8_ ^ 0x8000000080000000;
  auVar25._8_4_ = 0x80000000;
  auVar25._12_4_ = 0x80000000;
  local_128.z = -local_a8.z;
  local_128._0_8_ = vmovlps_avx(auVar25);
  FVar18 = AngleBetween<float>((Vector3<float> *)&local_128,(Vector3<float> *)&local_d8);
  auVar26._0_8_ = local_d8._0_8_ ^ 0x8000000080000000;
  auVar26._8_4_ = 0x80000000;
  auVar26._12_4_ = 0x80000000;
  local_128.z = -local_d8.z;
  local_128._0_8_ = vmovlps_avx(auVar26);
  FVar19 = AngleBetween<float>((Vector3<float> *)&local_128,(Vector3<float> *)&local_b8);
  auVar15._0_8_ = local_b8._0_8_ ^ 0x8000000080000000;
  auVar15._8_4_ = 0x80000000;
  auVar15._12_4_ = 0x80000000;
  local_128.z = -local_b8.z;
  local_128._0_8_ = vmovlps_avx(auVar15);
  FVar20 = AngleBetween<float>((Vector3<float> *)&local_128,(Vector3<float> *)&local_c8);
  dVar3 = (double)FVar17 + (double)FVar18 + (double)FVar19 + (double)FVar20 + -6.2831854820251465;
  auVar56 = ZEXT460((uint)((ulong)dVar3 >> 0x20));
  fVar57 = (float)dVar3;
  if (0.001 <= fVar57) {
    fVar2 = (float)local_f8._0_4_ * (float)local_f8._0_4_;
    local_11c = local_d8.z;
    local_f8._0_4_ = local_c8.z;
    fVar4 = local_c8.z * local_c8.z;
    auVar51 = (undefined1  [56])0x0;
    VVar70 = Point3<float>::operator-(pRect,pRef);
    local_128.z = VVar70.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar45._0_8_ = VVar70.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar45._8_56_ = auVar51;
    local_128._0_8_ = vmovlps_avx(auVar45._0_16_);
    VVar71 = Frame::ToLocal(&local_78,(Vector3f *)&local_128);
    auVar46._0_8_ = VVar71.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar46._8_56_ = auVar51;
    auVar25 = auVar46._0_16_;
    auVar24 = vminss_avx(ZEXT416((uint)fVar1),auVar25);
    uVar6 = vcmpss_avx512f(auVar25,local_e8,1);
    bVar7 = (bool)((byte)uVar6 & 1);
    auVar14._4_12_ = auVar24._4_12_;
    auVar14._0_4_ = (uint)bVar7 * local_e8._0_4_ + (uint)!bVar7 * auVar24._0_4_;
    uVar6 = vcmpss_avx512f(auVar14,ZEXT816(0) << 0x40,0);
    bVar7 = (bool)((byte)uVar6 & 1);
    fVar1 = (float)((uint)bVar7 * 0x2edbe6ff + (uint)!bVar7 * auVar14._0_4_);
    fVar4 = (fVar2 / (fVar1 * fVar1) + 1.0) - fVar4;
    if (fVar4 < 0.0) {
      auVar47._0_4_ = sqrtf(fVar4);
      auVar47._4_60_ = extraout_var;
      auVar24 = auVar47._0_16_;
    }
    else {
      auVar24 = vsqrtss_avx(ZEXT416((uint)fVar4),ZEXT416((uint)fVar4));
    }
    if (InvertSphericalRectangleSample(pbrt::Point3<float>const&,pbrt::Point3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Point3<float>const&)
        ::reg == '\0') {
      iVar12 = __cxa_guard_acquire(&InvertSphericalRectangleSample(pbrt::Point3<float>const&,pbrt::Point3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Point3<float>const&)
                                    ::reg);
      if (iVar12 != 0) {
        StatRegisterer::StatRegisterer
                  ((StatRegisterer *)
                   &InvertSphericalRectangleSample(pbrt::Point3<float>const&,pbrt::Point3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Point3<float>const&)
                    ::reg,InvertSphericalRectangleSample(pbrt::Point3<float>const&,pbrt::
                          Point3<float>const&,pbrt::Vector3<float>const&,pbrt::
                          Vector3<float>const&,pbrt::Point3<float>const&)::$_0::__invoke(pbrt::
                          StatsAccumulator__,(PixelAccumFunc)0x0);
        __cxa_guard_release(&InvertSphericalRectangleSample(pbrt::Point3<float>const&,pbrt::Point3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Point3<float>const&)
                             ::reg);
      }
    }
    *(long *)(in_FS_OFFSET + -0x2a0) = *(long *)(in_FS_OFFSET + -0x2a0) + 1;
    local_108 = vinsertps_avx(local_108,ZEXT416((uint)local_118._0_4_),0x10);
    local_118._4_4_ = local_108._4_4_ * local_108._4_4_;
    local_118._0_4_ = local_108._0_4_ * local_108._0_4_;
    fStack_110 = local_108._8_4_ * local_108._8_4_;
    fStack_10c = local_108._12_4_ * local_108._12_4_;
    auVar66._8_4_ = 0x7fffffff;
    auVar66._0_8_ = 0x7fffffff7fffffff;
    auVar66._12_4_ = 0x7fffffff;
    auVar13 = vpternlogd_avx512vl(ZEXT416((uint)fVar1),auVar24,auVar66,0xd8);
    if ((auVar13._0_4_ == 0.0) && (!NAN(auVar13._0_4_))) {
      *(long *)(in_FS_OFFSET + -0x2a8) = *(long *)(in_FS_OFFSET + -0x2a8) + 1;
    }
    auVar26 = vfmsub213ss_fma(ZEXT416((uint)local_f8._0_4_),ZEXT416((uint)local_f8._0_4_),
                              ZEXT416((uint)(local_11c * local_11c)));
    auVar66 = ZEXT416((uint)local_11c);
    auVar15 = vfnmadd231ss_fma(ZEXT416((uint)(local_11c * local_11c)),auVar66,auVar66);
    auVar26 = vmaxss_avx(ZEXT416((uint)(auVar26._0_4_ + auVar15._0_4_ + fVar4)),ZEXT816(0) << 0x40);
    auVar26 = vsqrtss_avx(auVar26,auVar26);
    auVar9._8_4_ = 0x80000000;
    auVar9._0_8_ = 0x8000000080000000;
    auVar9._12_4_ = 0x80000000;
    auVar14 = vxorps_avx512vl(auVar13,auVar9);
    auVar67._8_4_ = 0x7fffffff;
    auVar67._0_8_ = 0x7fffffff7fffffff;
    auVar67._12_4_ = 0x7fffffff;
    auVar15 = vpternlogd_avx512vl(ZEXT416((uint)((float)local_f8._0_4_ * auVar14._0_4_)),auVar67,
                                  ZEXT416((uint)((float)local_f8._0_4_ * auVar26._0_4_)),0xb8);
    auVar24 = vpand_avx(auVar67,auVar24);
    auVar15 = vfnmadd231ss_fma(auVar15,auVar66,auVar13);
    auVar24 = vfmsub231ss_fma(ZEXT416((uint)(auVar24._0_4_ * auVar26._0_4_)),
                              ZEXT416((uint)local_f8._0_4_),auVar66);
    auVar48._0_4_ = atan2f(auVar15._0_4_,auVar24._0_4_);
    auVar48._4_60_ = extraout_var_00;
    uVar6 = vcmpss_avx512f(ZEXT816(0) << 0x40,auVar48._0_16_,1);
    bVar7 = (bool)((byte)uVar6 & 1);
    uVar6 = vcmpss_avx512f(auVar13,ZEXT416((uint)auVar14._0_4_),0);
    bVar8 = (bool)((byte)uVar6 & 1);
    fVar2 = fVar1 * fVar1 + fVar2;
    auVar28._0_4_ = fVar2 + (float)local_118._0_4_;
    auVar28._4_4_ = fVar2 + (float)local_118._4_4_;
    auVar28._8_4_ = fVar2 + fStack_110;
    auVar28._12_4_ = fVar2 + fStack_10c;
    auVar24 = vsqrtps_avx(auVar28);
    auVar24 = vdivps_avx(local_108,auVar24);
    local_138 = VVar71.super_Tuple3<pbrt::Vector3,_float>.x;
    fStack_134 = VVar71.super_Tuple3<pbrt::Vector3,_float>.y;
    fStack_130 = auVar51._0_4_;
    fStack_12c = auVar51._4_4_;
    auVar29._0_4_ = local_138 * local_138;
    auVar29._4_4_ = fStack_134 * fStack_134;
    auVar29._8_4_ = fStack_130 * fStack_130;
    auVar29._12_4_ = fStack_12c * fStack_12c;
    auVar13 = vmovshdup_avx(auVar24);
    auVar26 = vmovshdup_avx(auVar29);
    fVar61 = auVar24._0_4_;
    fVar65 = auVar13._0_4_;
    fVar69 = fVar61 - fVar65;
    auVar15 = vfmsub213ss_fma(auVar24,auVar24,ZEXT416((uint)(fVar61 * fVar65)));
    auVar24 = vfnmadd231ss_fma(ZEXT416((uint)(fVar61 * fVar65)),auVar24,auVar13);
    fVar1 = auVar26._0_4_ + fVar2;
    auVar10._8_4_ = 0x7fffffff;
    auVar10._0_8_ = 0x7fffffff7fffffff;
    auVar10._12_4_ = 0x7fffffff;
    local_108 = vandps_avx512vl(ZEXT416((uint)fVar69),auVar10);
    local_118._0_4_ = fVar1;
    fVar4 = auVar15._0_4_ + auVar24._0_4_;
    fVar5 = auVar26._0_4_ * fVar1;
    if (fVar5 < 0.0) {
      local_e8._0_4_ = fVar5;
      local_f8 = ZEXT416((uint)fVar69);
      fVar21 = sqrtf(fVar5);
      fVar5 = (float)local_e8._0_4_;
      fVar1 = (float)local_118._0_4_;
      fVar69 = (float)local_f8._0_4_;
    }
    else {
      auVar24 = vsqrtss_avx(ZEXT416((uint)fVar5),ZEXT416((uint)fVar5));
      fVar21 = auVar24._0_4_;
    }
    fVar62 = local_108._0_4_;
    fVar68 = (float)((uint)bVar8 * 0x40490fdb +
                    (uint)!bVar8 *
                    ((uint)bVar7 * (int)(auVar48._0_4_ + -6.2831855) +
                    (uint)!bVar7 * (int)auVar48._0_4_)) + FVar19;
    fVar69 = fVar69 * fVar69;
    if (fVar5 < 0.0) {
      local_e8._0_4_ = fVar68;
      fVar22 = sqrtf(fVar5);
      fVar68 = (float)local_e8._0_4_;
      fVar5 = (float)local_118._0_4_;
    }
    else {
      auVar24 = vsqrtss_avx(ZEXT416((uint)fVar5),ZEXT416((uint)fVar5));
      fVar22 = auVar24._0_4_;
      fVar5 = fVar1;
    }
    auVar26 = vsqrtss_avx(in_XMM10,ZEXT416((uint)fVar2));
    auVar53._8_4_ = 0x3f800000;
    auVar53._0_8_ = 0x3f8000003f800000;
    auVar53._12_4_ = 0x3f800000;
    auVar58._4_4_ = fVar69;
    auVar58._0_4_ = fVar69;
    auVar58._8_4_ = fVar69;
    auVar58._12_4_ = fVar69;
    auVar24 = vinsertps_avx(ZEXT416((uint)(fVar4 - (fVar62 * fVar21) / fVar1)),
                            ZEXT416((uint)(fVar4 + (local_108._0_4_ * fVar22) / fVar5)),0x10);
    auVar24 = vdivps_avx(auVar24,auVar58);
    fStack_174 = auVar13._4_4_;
    fStack_170 = auVar13._8_4_;
    fStack_16c = auVar13._12_4_;
    auVar64._0_4_ = auVar24._0_4_ * fVar65;
    auVar64._4_4_ = auVar24._4_4_ * fStack_174;
    auVar64._8_4_ = auVar24._8_4_ * fStack_170;
    auVar64._12_4_ = auVar24._12_4_ * fStack_16c;
    auVar13 = vsubps_avx(auVar53,auVar24);
    auVar59._4_4_ = fVar61;
    auVar59._0_4_ = fVar61;
    auVar59._8_4_ = fVar61;
    auVar59._12_4_ = fVar61;
    auVar13 = vfmadd213ps_fma(auVar59,auVar13,auVar64);
    fVar1 = auVar13._0_4_;
    auVar30._0_4_ = fVar1 * fVar1;
    fVar2 = auVar13._4_4_;
    auVar30._4_4_ = fVar2 * fVar2;
    fVar4 = auVar13._8_4_;
    auVar30._8_4_ = fVar4 * fVar4;
    fVar5 = auVar13._12_4_;
    auVar30._12_4_ = fVar5 * fVar5;
    auVar13 = vmovshdup_avx(auVar30);
    fVar69 = 1.0 - auVar30._0_4_;
    if (fVar69 < 0.0) {
      auVar49._0_4_ = sqrtf(fVar69);
      auVar49._4_60_ = extraout_var_01;
      auVar15 = auVar49._0_16_;
    }
    else {
      auVar15 = vsqrtss_avx(ZEXT416((uint)fVar69),ZEXT416((uint)fVar69));
    }
    fVar69 = auVar26._0_4_;
    auVar60._0_4_ = fVar69 * fVar1;
    auVar60._4_4_ = fVar69 * fVar2;
    auVar60._8_4_ = fVar69 * fVar4;
    auVar60._12_4_ = fVar69 * fVar5;
    fVar1 = 1.0 - auVar13._0_4_;
    if (fVar1 < 0.0) {
      auVar50._0_4_ = sqrtf(fVar1);
      auVar50._4_60_ = extraout_var_02;
      auVar13 = auVar50._0_16_;
    }
    else {
      auVar13 = vsqrtss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1));
    }
    auVar14 = ZEXT416((uint)((FVar20 + fVar68) / fVar57));
    auVar13 = vinsertps_avx(auVar15,auVar13,0x10);
    auVar26 = vmovshdup_avx(auVar25);
    uVar6 = vcmpss_avx512f(auVar14,ZEXT816(0) << 0x40,1);
    auVar25 = vdivps_avx(auVar60,auVar13);
    auVar25 = vsubps_avx(auVar25,auVar26);
    auVar11._8_4_ = 0x7fffffff;
    auVar11._0_8_ = 0x7fffffff7fffffff;
    auVar11._12_4_ = 0x7fffffff;
    auVar13 = vandps_avx512vl(auVar25,auVar11);
    auVar25 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar14);
    iVar12 = (uint)!(bool)((byte)uVar6 & 1) * auVar25._0_4_;
    auVar16._4_12_ = auVar25._4_12_;
    auVar16._0_4_ = iVar12;
    auVar25 = vshufps_avx(auVar13,auVar13,0xf5);
    if (auVar25._0_4_ <= auVar13._0_4_) {
      auVar31._4_12_ = auVar24._4_12_;
      auVar31._0_4_ = iVar12;
      TVar23 = auVar31._0_8_;
    }
    else {
      auVar24 = vinsertps_avx(auVar16,ZEXT416((uint)auVar24._0_4_),0x1c);
      TVar23 = auVar24._0_8_;
    }
  }
  else {
    auVar51 = extraout_var_03;
    VVar70 = Point3<float>::operator-(pRect,s);
    auVar55._0_4_ = VVar70.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar55._4_60_ = auVar56;
    auVar44._0_8_ = VVar70.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar44._8_56_ = auVar51;
    fVar1 = (ex->super_Tuple3<pbrt::Vector3,_float>).y;
    fVar57 = (ex->super_Tuple3<pbrt::Vector3,_float>).x;
    auVar26 = auVar44._0_16_;
    auVar24 = vmovshdup_avx(auVar26);
    fVar2 = (ex->super_Tuple3<pbrt::Vector3,_float>).z;
    auVar25 = vfmadd231ss_fma(ZEXT416((uint)(auVar24._0_4_ * fVar1)),auVar26,ZEXT416((uint)fVar57));
    auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * fVar1)),ZEXT416((uint)fVar57),
                              ZEXT416((uint)fVar57));
    auVar25 = vfmadd231ss_fma(auVar25,auVar55._0_16_,ZEXT416((uint)fVar2));
    auVar13 = vfmadd231ss_fma(auVar13,ZEXT416((uint)fVar2),ZEXT416((uint)fVar2));
    auVar63._0_4_ = auVar25._0_4_ / auVar13._0_4_;
    auVar63._4_12_ = auVar25._4_12_;
    fVar1 = (ey->super_Tuple3<pbrt::Vector3,_float>).y;
    fVar57 = (ey->super_Tuple3<pbrt::Vector3,_float>).x;
    auVar24 = vfmadd231ss_fma(ZEXT416((uint)(auVar24._0_4_ * fVar1)),ZEXT416((uint)fVar57),auVar26);
    fVar2 = (ey->super_Tuple3<pbrt::Vector3,_float>).z;
    auVar25 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * fVar1)),ZEXT416((uint)fVar57),
                              ZEXT416((uint)fVar57));
    auVar24 = vfmadd231ss_fma(auVar24,ZEXT416((uint)fVar2),auVar55._0_16_);
    auVar25 = vfmadd231ss_fma(auVar25,ZEXT416((uint)fVar2),ZEXT416((uint)fVar2));
    auVar27._0_4_ = auVar24._0_4_ / auVar25._0_4_;
    auVar27._4_12_ = auVar24._4_12_;
    auVar24 = vinsertps_avx(auVar63,auVar27,0x10);
    TVar23 = auVar24._0_8_;
  }
  return (Point2f)TVar23;
}

Assistant:

Point2f InvertSphericalRectangleSample(const Point3f &pRef, const Point3f &s,
                                       const Vector3f &ex, const Vector3f &ey,
                                       const Point3f &pRect) {
    // TODO: Delete anything unused in the below...

    // SphQuadInit()
    // local reference system 'R'
    Float exl = Length(ex), eyl = Length(ey);
    Frame R = Frame::FromXY(ex / exl, ey / eyl);

    // compute rectangle coords in local reference system
    Vector3f d = s - pRef;
    Vector3f dLocal = R.ToLocal(d);
    Float z0 = dLocal.z;

    // flip 'z' to make it point against 'Q'
    if (z0 > 0) {
        R.z = -R.z;
        z0 *= -1;
    }
    Float z0sq = Sqr(z0);
    Float x0 = dLocal.x;
    Float y0 = dLocal.y;
    Float x1 = x0 + exl;
    Float y1 = y0 + eyl;
    Float y0sq = Sqr(y0), y1sq = Sqr(y1);

    // create vectors to four vertices
    Vector3f v00(x0, y0, z0), v01(x0, y1, z0);
    Vector3f v10(x1, y0, z0), v11(x1, y1, z0);

    // compute normals to edges
    Vector3f n0 = Normalize(Cross(v00, v10));
    Vector3f n1 = Normalize(Cross(v10, v11));
    Vector3f n2 = Normalize(Cross(v11, v01));
    Vector3f n3 = Normalize(Cross(v01, v00));

    // compute internal angles (gamma_i)
    Float g0 = AngleBetween(-n0, n1);
    Float g1 = AngleBetween(-n1, n2);
    Float g2 = AngleBetween(-n2, n3);
    Float g3 = AngleBetween(-n3, n0);

    // compute predefined constants
    Float b0 = n0.z, b1 = n2.z, b0sq = Sqr(b0), b1sq = Sqr(b1);

    // compute solid angle from internal angles
    Float solidAngle = double(g0) + double(g1) + double(g2) + double(g3) - 2. * Pi;

    // TODO: this (rarely) goes differently than sample. figure out why...
    if (solidAngle < 1e-3) {
        Vector3f pq = pRect - s;
        return Point2f(Dot(pq, ex) / LengthSquared(ex), Dot(pq, ey) / LengthSquared(ey));
    }

    Vector3f v = R.ToLocal(pRect - pRef);
    Float xu = v.x, yv = v.y;

    xu = Clamp(xu, x0, x1);  // avoid Infs
    if (xu == 0)
        xu = 1e-10;

    // DOing all this in double actually makes things slightly worse???!?
    // Float fusq = (1 - b0sq * Sqr(cu)) / Sqr(cu);
    // Float fusq = 1 / Sqr(cu) - b0sq;  // more stable
    Float invcusq = 1 + z0sq / Sqr(xu);
    Float fusq = invcusq - b0sq;  // the winner so far
    Float fu = std::copysign(std::sqrt(fusq), xu);
    // Note, though have 1 + z^2/x^2 - b0^2, which isn't great if b0 \approx 1
    // double fusq = 1. - Sqr(double(b0)) + Sqr(double(z0) / double(xu));  //
    // this is worse?? double fu = std::copysign(std::sqrt(fusq), cu);
    CHECK_RARE(1e-6, fu == 0);

    // State of the floating point world: in the bad cases, about half the
    // error seems to come from inaccuracy in fu and half comes from
    // inaccuracy in sqrt/au.
    //
    // For fu, the main issue comes adding a small value to 1+ in invcusq
    // and then having b0sq be close to one, so having catastrophic
    // cancellation affect fusq. Approximating it as z0sq / Sqr(xu) when
    // b0sq is close to one doesn't help, however..
    //
    // For au, DifferenceOfProducts doesn't seem to help with the two
    // factors. Furthermore, while it would be nice to think about this
    // like atan(y/x) and then rewrite/simplify y/x, we need to do so in a
    // way that doesn't flip the sign of x and y, which would be fine if we
    // were computing y/x, but messes up atan2's quadrant-determinations...

    Float sqrt = SafeSqrt(DifferenceOfProducts(b0, b0, b1, b1) + fusq);
    // No benefit to difference of products here...
    Float au = std::atan2(-(b1 * fu) - std::copysign(b0 * sqrt, fu * b0),
                          b0 * b1 - sqrt * std::abs(fu));
    if (au > 0)
        au -= 2 * Pi;

    if (fu == 0)
        au = Pi;
    Float u0 = (au + g2 + g3) / solidAngle;

    Float ddsq = Sqr(xu) + z0sq;
    Float dd = std::sqrt(ddsq);
    Float h0 = y0 / std::sqrt(ddsq + y0sq);
    Float h1 = y1 / std::sqrt(ddsq + y1sq);
    Float yvsq = Sqr(yv);

    Float u1[2] = {(DifferenceOfProducts(h0, h0, h0, h1) -
                    std::abs(h0 - h1) * std::sqrt(yvsq * (ddsq + yvsq)) / (ddsq + yvsq)) /
                       Sqr(h0 - h1),
                   (DifferenceOfProducts(h0, h0, h0, h1) +
                    std::abs(h0 - h1) * std::sqrt(yvsq * (ddsq + yvsq)) / (ddsq + yvsq)) /
                       Sqr(h0 - h1)};

    // TODO: yuck is there a better way to figure out which is the right
    // solution?
    Float hv[2] = {Lerp(u1[0], h0, h1), Lerp(u1[1], h0, h1)};
    Float hvsq[2] = {Sqr(hv[0]), Sqr(hv[1])};
    Float yz[2] = {(hv[0] * dd) / std::sqrt(1 - hvsq[0]),
                   (hv[1] * dd) / std::sqrt(1 - hvsq[1])};

    Point2f u = (std::abs(yz[0] - yv) < std::abs(yz[1] - yv))
                    ? Point2f(Clamp(u0, 0, 1), u1[0])
                    : Point2f(Clamp(u0, 0, 1), u1[1]);

    return u;
}